

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

char * vrna_random_string(int l,char *symbols)

{
  size_t sVar1;
  char *pcVar2;
  double dVar3;
  int base;
  int rn;
  int i;
  char *r;
  char *symbols_local;
  int l_local;
  
  sVar1 = strlen(symbols);
  pcVar2 = (char *)vrna_alloc(l + 1);
  for (base = 0; base < l; base = base + 1) {
    dVar3 = vrna_urn();
    pcVar2[base] = symbols[(int)(dVar3 * (double)(int)sVar1)];
  }
  pcVar2[l] = '\0';
  return pcVar2;
}

Assistant:

PUBLIC char *
vrna_random_string(int        l,
                   const char symbols[])
{
  char  *r;
  int   i, rn, base;

  base  = (int)strlen(symbols);
  r     = (char *)vrna_alloc(sizeof(char) * (l + 1));

  for (i = 0; i < l; i++) {
    rn    = (int)(vrna_urn() * base); /* [0, base-1] */
    r[i]  = symbols[rn];
  }
  r[l] = '\0';
  return r;
}